

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O0

bool __thiscall
irr::scene::CB3DMeshFileLoader::readChunkBONE(CB3DMeshFileLoader *this,SJoint *inJoint)

{
  pointer pSVar1;
  uint uVar2;
  u32 uVar3;
  SB3dChunk *pSVar4;
  long lVar5;
  int *piVar6;
  undefined2 *puVar7;
  undefined8 in_RSI;
  array<irr::scene::SB3dChunk> *in_RDI;
  double __x;
  double __x_00;
  SWeight *weight;
  f32 strength;
  u32 globalVertexID;
  u32 in_stack_ffffffffffffffac;
  array<int> *in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffc8;
  float local_20;
  uint local_1c;
  undefined8 local_18;
  
  local_18 = in_RSI;
  pSVar4 = core::array<irr::scene::SB3dChunk>::getLast((array<irr::scene::SB3dChunk> *)0x2ced31);
  if (8 < pSVar4->length) {
    while( true ) {
      pSVar4 = core::array<irr::scene::SB3dChunk>::getLast((array<irr::scene::SB3dChunk> *)0x2ced4b)
      ;
      in_stack_ffffffffffffffc8 = pSVar4->startposition;
      pSVar4 = core::array<irr::scene::SB3dChunk>::getLast((array<irr::scene::SB3dChunk> *)0x2ced62)
      ;
      in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + pSVar4->length;
      lVar5 = (**(code **)(*(long *)in_RDI[6].m_data.
                                    super__Vector_base<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x18))();
      if (in_stack_ffffffffffffffc8 <= lVar5) break;
      pSVar1 = in_RDI[6].m_data.
               super__Vector_base<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (*(code *)**(undefined8 **)pSVar1)(pSVar1,&local_1c,4);
      pSVar1 = in_RDI[6].m_data.
               super__Vector_base<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (*(code *)**(undefined8 **)pSVar1)(pSVar1,&local_20,4);
      uVar2 = *(int *)&in_RDI[6].is_sorted + local_1c;
      local_1c = uVar2;
      uVar3 = core::array<int>::size((array<int> *)0x2cedf3);
      if (uVar3 <= uVar2) {
        __x = (double)(**(code **)(*(long *)in_RDI[6].m_data.
                                            super__Vector_base<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                  0x20))();
        os::Printer::log(__x);
        return false;
      }
      piVar6 = core::array<int>::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      if (*piVar6 == -1) {
        os::Printer::log((Printer *)
                         "B3dMeshLoader: Weight has bad vertex id (no link to meshbuffer index found)"
                         ,__x_00);
      }
      else if (0.0 < local_20) {
        pSVar1 = in_RDI[6].m_data.
                 super__Vector_base<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        puVar7 = (undefined2 *)(**(code **)(*(long *)pSVar1 + 0x100))(pSVar1,local_18);
        *(float *)(puVar7 + 4) = local_20;
        piVar6 = core::array<int>::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
        *(int *)(puVar7 + 2) = *piVar6;
        piVar6 = core::array<int>::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
        *puVar7 = (short)*piVar6;
      }
    }
  }
  uVar3 = (u32)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  core::array<irr::scene::SB3dChunk>::size((array<irr::scene::SB3dChunk> *)0x2ceef5);
  core::array<irr::scene::SB3dChunk>::erase(in_RDI,uVar3);
  return true;
}

Assistant:

bool CB3DMeshFileLoader::readChunkBONE(CSkinnedMesh::SJoint *inJoint)
{
#ifdef _B3D_READER_DEBUG
	core::stringc logStr;
	for (u32 i = 1; i < B3dStack.size(); ++i)
		logStr += "-";
	logStr += "read ChunkBONE";
	os::Printer::log(logStr.c_str(), ELL_DEBUG);
#endif

	if (B3dStack.getLast().length > 8) {
		while ((B3dStack.getLast().startposition + B3dStack.getLast().length) > B3DFile->getPos()) // this chunk repeats
		{
			u32 globalVertexID;
			f32 strength;
			B3DFile->read(&globalVertexID, sizeof(globalVertexID));
			B3DFile->read(&strength, sizeof(strength));
#ifdef __BIG_ENDIAN__
			globalVertexID = os::Byteswap::byteswap(globalVertexID);
			strength = os::Byteswap::byteswap(strength);
#endif
			globalVertexID += VerticesStart;

			if (globalVertexID >= AnimatedVertices_VertexID.size()) {
				os::Printer::log("Illegal vertex index found", B3DFile->getFileName(), ELL_ERROR);
				return false;
			}

			if (AnimatedVertices_VertexID[globalVertexID] == -1) {
				os::Printer::log("B3dMeshLoader: Weight has bad vertex id (no link to meshbuffer index found)");
			} else if (strength > 0) {
				CSkinnedMesh::SWeight *weight = AnimatedMesh->addWeight(inJoint);
				weight->strength = strength;
				// Find the meshbuffer and Vertex index from the Global Vertex ID:
				weight->vertex_id = AnimatedVertices_VertexID[globalVertexID];
				weight->buffer_id = AnimatedVertices_BufferID[globalVertexID];
			}
		}
	}

	B3dStack.erase(B3dStack.size() - 1);
	return true;
}